

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-engine.cpp
# Opt level: O0

void __thiscall gepard::GepardEngine::rect(GepardEngine *this,Float x,Float y,Float w,Float h)

{
  Float h_local;
  Float w_local;
  Float y_local;
  Float x_local;
  GepardEngine *this_local;
  
  moveTo(this,x,y);
  lineTo(this,x + w,y);
  lineTo(this,x + w,y + h);
  lineTo(this,x,y + h);
  closePath(this);
  return;
}

Assistant:

void GepardEngine::rect(Float x, Float y, Float w, Float h)
{
    moveTo(x, y);
    lineTo(x + w, y);
    lineTo(x + w, y + h);
    lineTo(x, y + h);
    closePath();
}